

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O0

string * __thiscall ProblemAloha::SoftPrintBriefDescription_abi_cxx11_(ProblemAloha *this)

{
  AlohaVariation AVar1;
  IslandConfiguration IVar2;
  ostream *poVar3;
  ulong uVar4;
  size_t sVar5;
  ProblemAloha *in_RSI;
  string *in_RDI;
  stringstream ss;
  string local_1e8 [32];
  string local_1c8 [4];
  IslandConfiguration in_stack_fffffffffffffe3c;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar3 = std::operator<<(local_188,"Aloha_");
  AVar1 = GetVariation(in_RSI);
  (**(code **)(*(long *)&(in_RSI->super_FactoredDecPOMDPDiscrete).
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 0x328))(local_1c8,in_RSI,AVar1);
  poVar3 = std::operator<<(poVar3,local_1c8);
  std::operator<<(poVar3,"_");
  std::__cxx11::string::~string(local_1c8);
  IVar2 = GetIslandConfiguration(in_RSI);
  if (IVar2 == InLine) {
    uVar4 = (**(code **)(*(long *)&(in_RSI->super_FactoredDecPOMDPDiscrete).
                                   super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                   super_MultiAgentDecisionProcess + 0x10))();
    std::ostream::operator<<(local_188,uVar4);
  }
  GetIslandConfiguration(in_RSI);
  IslandConfigToString_abi_cxx11_(in_stack_fffffffffffffe3c);
  poVar3 = std::operator<<(local_188,local_1e8);
  poVar3 = std::operator<<(poVar3,"_maxBL");
  sVar5 = GetMaxBacklog(in_RSI);
  std::ostream::operator<<(poVar3,sVar5);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string ProblemAloha::SoftPrintBriefDescription() const
{
    stringstream ss;
    ss << "Aloha_" << SoftPrintVariation(GetVariation())
       << "_";
    if(GetIslandConfiguration()==InLine)
        ss << GetNrAgents();
    ss << IslandConfigToString(GetIslandConfiguration()) << "_maxBL"
       << GetMaxBacklog();
    return ss.str();
}